

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O1

void EpdSubtract2(EpDouble *epd1,EpDouble *epd2)

{
  int iVar1;
  int __exponent;
  int iVar2;
  ulong uVar3;
  EpType val;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if ((SUB84(epd1->type,4) >> 0x14 < 0xfff ||
       ((ulong)epd1->type & 0xfffffffffffff) != 0x8000000000000) &&
     (((ulong)epd2->type & 0xfffffffffffff) != 0x8000000000000 ||
      (ulong)epd2->type < 0xfff0000000000000)) {
    uVar3 = (ulong)epd1->type & 0x7fffffffffffffff;
    if (uVar3 == 0x7ff0000000000000) {
LAB_00810c59:
      if (((ulong)epd2->type & 0x7fffffffffffffff) == 0x7ff0000000000000) {
        if ((long)((ulong)epd2->type ^ (ulong)epd1->type) < 0) {
          return;
        }
        goto LAB_00810c8a;
      }
    }
    else {
      if (((ulong)epd2->type & 0x7fffffffffffffff) != 0x7ff0000000000000) {
        if (((ulong)epd1->type & 0x7ff0000000000000) != 0x3ff0000000000000) {
          __assert_fail("epd1->type.bits.exponent == EPD_MAX_BIN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/epd/epd.c"
                        ,0x329,"void EpdSubtract2(EpDouble *, EpDouble *)");
        }
        if (((ulong)epd2->type & 0x7ff0000000000000) != 0x3ff0000000000000) {
          __assert_fail("epd2->type.bits.exponent == EPD_MAX_BIN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/epd/epd.c"
                        ,0x32a,"void EpdSubtract2(EpDouble *, EpDouble *)");
        }
        iVar2 = epd1->exponent;
        iVar1 = epd2->exponent;
        __exponent = iVar2 - iVar1;
        if (__exponent == 0 || iVar2 < iVar1) {
          if (iVar2 < iVar1) {
            if (iVar1 - iVar2 < 0x400) {
              dVar5 = (epd1->type).value;
              dVar6 = ldexp(1.0,iVar1 - iVar2);
              dVar5 = dVar5 / dVar6 - (epd2->type).value;
            }
            else {
              dVar5 = -epd2->type;
            }
            iVar2 = epd2->exponent;
          }
          else {
            dVar5 = (epd1->type).value - (epd2->type).value;
          }
        }
        else {
          dVar5 = (epd1->type).value;
          if (__exponent < 0x400) {
            dVar6 = (epd2->type).value;
            dVar4 = ldexp(1.0,__exponent);
            dVar5 = dVar5 - dVar6 / dVar4;
          }
          iVar2 = epd1->exponent;
        }
        (epd1->type).value = dVar5;
        epd1->exponent = iVar2;
        EpdNormalize(epd1);
        return;
      }
      if (uVar3 == 0x7ff0000000000000) goto LAB_00810c59;
    }
    if (((ulong)epd2->type & 0x7fffffffffffffff) == 0x7ff0000000000000) {
      epd1->type = epd2->type;
      epd1->exponent = epd2->exponent;
    }
  }
  else {
LAB_00810c8a:
    (epd1->type).value = -NAN;
    epd1->exponent = 0;
  }
  return;
}

Assistant:

void
EpdSubtract2(EpDouble *epd1, EpDouble *epd2)
{
  double        value;
  int           exponent, diff;

  if (EpdIsNan(epd1) || EpdIsNan(epd2)) {
    EpdMakeNan(epd1);
    return;
  } else if (EpdIsInf(epd1) || EpdIsInf(epd2)) {
    int sign;

    if (EpdIsInf(epd1) && EpdIsInf(epd2)) {
      sign = epd1->type.bits.sign ^ epd2->type.bits.sign;
      if (sign == 0)
        EpdMakeNan(epd1);
    } else if (EpdIsInf(epd2)) {
      EpdCopy(epd2, epd1);
    }
    return;
  }

  assert(epd1->type.bits.exponent == EPD_MAX_BIN);
  assert(epd2->type.bits.exponent == EPD_MAX_BIN);

  if (epd1->exponent > epd2->exponent) {
    diff = epd1->exponent - epd2->exponent;
    if (diff <= EPD_MAX_BIN) {
      value = epd1->type.value -
                epd2->type.value / pow((double)2.0, (double)diff);
    } else
      value = epd1->type.value;
    exponent = epd1->exponent;
  } else if (epd1->exponent < epd2->exponent) {
    diff = epd2->exponent - epd1->exponent;
    if (diff <= EPD_MAX_BIN) {
      value = epd1->type.value / pow((double)2.0, (double)diff) -
                epd2->type.value;
    } else
      value = epd2->type.value * (double)(-1.0);
    exponent = epd2->exponent;
  } else {
    value = epd1->type.value - epd2->type.value;
    exponent = epd1->exponent;
  }
  epd1->type.value = value;
  epd1->exponent = exponent;
  EpdNormalize(epd1);
}